

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QGesture*,QPointer<QWidget>>::emplaceValue<QPointer<QWidget>const&>
          (Node<QGesture*,QPointer<QWidget>> *this,QPointer<QWidget> *args)

{
  Data *pDVar1;
  QObject *pQVar2;
  int *piVar3;
  
  pDVar1 = (args->wp).d;
  pQVar2 = (args->wp).value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + 1;
    UNLOCK();
  }
  piVar3 = *(int **)(this + 8);
  *(Data **)(this + 8) = pDVar1;
  *(QObject **)(this + 0x10) = pQVar2;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }